

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<const_std::vector<void_*,_std::allocator<void_*>_>_&> *
testing::internal::
MatcherCastImpl<const_std::vector<void_*,_std::allocator<void_*>_>_&,_testing::internal::UnorderedElementsAreArrayMatcher<void_*>_>
::CastImpl<false>(Matcher<const_std::vector<void_*,_std::allocator<void_*>_>_&>
                  *__return_storage_ptr__,
                 UnorderedElementsAreArrayMatcher *polymorphic_matcher_or_value)

{
  UnorderedElementsAreArrayMatcher<void_*> *polymorphic_matcher_or_value_local;
  
  UnorderedElementsAreArrayMatcher::operator_cast_to_Matcher
            (__return_storage_ptr__,polymorphic_matcher_or_value);
  return __return_storage_ptr__;
}

Assistant:

static Matcher<T> CastImpl(const M& polymorphic_matcher_or_value,
                             std::true_type /* convertible_to_matcher */,
                             std::integral_constant<bool, Ignore>) {
    // M is implicitly convertible to Matcher<T>, which means that either
    // M is a polymorphic matcher or Matcher<T> has an implicit constructor
    // from M.  In both cases using the implicit conversion will produce a
    // matcher.
    //
    // Even if T has an implicit constructor from M, it won't be called because
    // creating Matcher<T> would require a chain of two user-defined conversions
    // (first to create T from M and then to create Matcher<T> from T).
    return polymorphic_matcher_or_value;
  }